

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O0

void bs_predict_mean(vw *all,example *ec,vector<double,_std::allocator<double>_> *pred_vec)

{
  const_iterator __first;
  const_iterator __last;
  size_type sVar1;
  vector<double,_std::allocator<double>_> *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  float fVar2;
  double dVar3;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  __first = std::vector<double,_std::allocator<double>_>::cbegin
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  __last = std::vector<double,_std::allocator<double>_>::cend
                     ((vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  dVar3 = std::
          accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )__last._M_current,
                     (double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  fVar2 = (float)dVar3;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  *(float *)(in_RSI + 0x6850) = fVar2 / (float)sVar1;
  if ((0.0 < *(float *)(in_RSI + 0x6870)) &&
     ((*(float *)(in_RSI + 0x6828) != 3.4028235e+38 || (NAN(*(float *)(in_RSI + 0x6828)))))) {
    fVar2 = (float)(**(code **)(*(long *)in_RDI[0x6a9] + 8))
                             (*(undefined4 *)(in_RSI + 0x6850),*(undefined4 *)(in_RSI + 0x6828),
                              (long *)in_RDI[0x6a9],*in_RDI);
    *(float *)(in_RSI + 0x68b0) = fVar2 * *(float *)(in_RSI + 0x6870);
  }
  return;
}

Assistant:

void bs_predict_mean(vw& all, example& ec, vector<double>& pred_vec)
{
  ec.pred.scalar = (float)accumulate(pred_vec.cbegin(), pred_vec.cend(), 0.0) / pred_vec.size();
  if (ec.weight > 0 && ec.l.simple.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ec.l.simple.label) * ec.weight;
}